

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O1

void ym3526_update_one(void *chip,UINT32 length,DEV_SMPL **buffer)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  DEV_SMPL DVar4;
  DEV_SMPL *pDVar5;
  DEV_SMPL *pDVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  
  if (length == 0) {
    uVar9 = 0;
    do {
      lVar7 = (ulong)(uVar9 >> 1) * 0xc0 + 0x20;
      lVar11 = (ulong)(uVar9 & 1) * 0x58;
      if (*(char *)((long)chip + lVar11 + 0x32 + lVar7) == '\x04') {
        lVar11 = lVar11 + lVar7;
        bVar1 = *(byte *)((long)chip + lVar11 + 0x44);
        if (((*(uint *)((long)chip + 0x6e8) & ~(-1 << (bVar1 & 0x1f))) == 0) &&
           ((int)((uint)""[(ulong)(*(uint *)((long)chip + 0x6e8) >> (bVar1 & 0x1f) & 7) +
                           (ulong)*(byte *)((long)chip + lVar11 + 0x45)] *
                 ~*(uint *)((long)chip + lVar11 + 0x3c)) < 8)) {
          *(undefined4 *)((long)chip + lVar11 + 0x3c) = 0;
          *(undefined1 *)((long)chip + lVar11 + 0x32) = 3;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 0x12);
  }
  else {
    bVar1 = *(byte *)((long)chip + 0x6f8);
    pDVar5 = *buffer;
    pDVar6 = buffer[1];
    uVar14 = 0;
    do {
      *(undefined4 *)((long)chip + 0x17c4) = 0;
      uVar9 = *(int *)((long)chip + 0x1708) + *(int *)((long)chip + 0x170c);
      uVar8 = *(int *)((long)chip + 0x1708) + 0x2e000000 + *(int *)((long)chip + 0x170c);
      if (uVar9 < 0xd2000000) {
        uVar8 = uVar9;
      }
      *(uint *)((long)chip + 0x1708) = uVar8;
      bVar10 = ""[uVar8 >> 0x18] >> 2;
      if (*(char *)((long)chip + 0x1704) != '\0') {
        bVar10 = ""[uVar8 >> 0x18];
      }
      *(uint *)((long)chip + 0x16fc) = (uint)bVar10;
      uVar9 = *(int *)((long)chip + 0x1710) + *(int *)((long)chip + 0x1714);
      *(uint *)((long)chip + 0x1710) = uVar9;
      *(uint *)((long)chip + 0x1700) = (uint)*(byte *)((long)chip + 0x1705) | uVar9 >> 0x18 & 7;
      if (*(char *)((long)chip + 0xdd) == '\0') {
        *(undefined4 *)((long)chip + 0x17c0) = 0;
        iVar12 = *(int *)((long)chip + 0x5c);
        iVar13 = *(int *)((long)chip + 0x58);
        uVar9 = *(uint *)((long)chip + 0x70);
        uVar8 = *(uint *)((long)chip + 0x16fc);
        iVar2 = *(int *)((long)chip + 0x48);
        iVar3 = *(int *)((long)chip + 0x4c);
        *(int *)((long)chip + 0x48) = iVar3;
        **(int **)((long)chip + 0x40) = **(int **)((long)chip + 0x40) + iVar3;
        uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
        *(undefined4 *)((long)chip + 0x4c) = 0;
        if (uVar9 < 0x180) {
          iVar12 = 0;
          iVar13 = iVar3 + iVar2;
          if (*(byte *)((long)chip + 0x38) == 0) {
            iVar13 = iVar12;
          }
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((*(uint *)((long)chip + 0x30) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)chip + 0x38) & 0x1f)) >> 0x10 & 0x3ff) +
                          (uint)*(ushort *)((long)chip + 0x76)];
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x4c) = iVar12;
        }
        uVar9 = (*(uint *)((long)chip + 200) & *(uint *)((long)chip + 0x16fc)) +
                *(int *)((long)chip + 0xb4) + *(int *)((long)chip + 0xb0);
        if (uVar9 < 0x180) {
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((uint)*(ushort *)((long)chip + 0x8a) + *(int *)((long)chip + 0x17c0) &
                          0x3ff) + (uint)*(ushort *)((long)chip + 0xce)];
          iVar12 = 0;
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x17c4) = *(int *)((long)chip + 0x17c4) + iVar12;
        }
      }
      if (*(char *)((long)chip + 0x19d) == '\0') {
        *(undefined4 *)((long)chip + 0x17c0) = 0;
        iVar12 = *(int *)((long)chip + 0x11c);
        iVar13 = *(int *)((long)chip + 0x118);
        uVar9 = *(uint *)((long)chip + 0x130);
        uVar8 = *(uint *)((long)chip + 0x16fc);
        iVar2 = *(int *)((long)chip + 0x108);
        iVar3 = *(int *)((long)chip + 0x10c);
        *(int *)((long)chip + 0x108) = iVar3;
        **(int **)((long)chip + 0x100) = **(int **)((long)chip + 0x100) + iVar3;
        uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
        *(undefined4 *)((long)chip + 0x10c) = 0;
        if (uVar9 < 0x180) {
          iVar12 = 0;
          iVar13 = iVar3 + iVar2;
          if (*(byte *)((long)chip + 0xf8) == 0) {
            iVar13 = iVar12;
          }
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((*(uint *)((long)chip + 0xf0) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)chip + 0xf8) & 0x1f)) >> 0x10 & 0x3ff) +
                          (uint)*(ushort *)((long)chip + 0x136)];
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x10c) = iVar12;
        }
        uVar9 = (*(uint *)((long)chip + 0x188) & *(uint *)((long)chip + 0x16fc)) +
                *(int *)((long)chip + 0x174) + *(int *)((long)chip + 0x170);
        if (uVar9 < 0x180) {
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((uint)*(ushort *)((long)chip + 0x14a) + *(int *)((long)chip + 0x17c0) &
                          0x3ff) + (uint)*(ushort *)((long)chip + 0x18e)];
          iVar12 = 0;
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x17c4) = *(int *)((long)chip + 0x17c4) + iVar12;
        }
      }
      if (*(char *)((long)chip + 0x25d) == '\0') {
        *(undefined4 *)((long)chip + 0x17c0) = 0;
        iVar12 = *(int *)((long)chip + 0x1dc);
        iVar13 = *(int *)((long)chip + 0x1d8);
        uVar9 = *(uint *)((long)chip + 0x1f0);
        uVar8 = *(uint *)((long)chip + 0x16fc);
        iVar2 = *(int *)((long)chip + 0x1c8);
        iVar3 = *(int *)((long)chip + 0x1cc);
        *(int *)((long)chip + 0x1c8) = iVar3;
        **(int **)((long)chip + 0x1c0) = **(int **)((long)chip + 0x1c0) + iVar3;
        uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
        *(undefined4 *)((long)chip + 0x1cc) = 0;
        if (uVar9 < 0x180) {
          iVar12 = 0;
          iVar13 = iVar3 + iVar2;
          if (*(byte *)((long)chip + 0x1b8) == 0) {
            iVar13 = iVar12;
          }
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((*(uint *)((long)chip + 0x1b0) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)chip + 0x1b8) & 0x1f)) >> 0x10 & 0x3ff) +
                          (uint)*(ushort *)((long)chip + 0x1f6)];
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x1cc) = iVar12;
        }
        uVar9 = (*(uint *)((long)chip + 0x248) & *(uint *)((long)chip + 0x16fc)) +
                *(int *)((long)chip + 0x234) + *(int *)((long)chip + 0x230);
        if (uVar9 < 0x180) {
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((uint)*(ushort *)((long)chip + 0x20a) + *(int *)((long)chip + 0x17c0) &
                          0x3ff) + (uint)*(ushort *)((long)chip + 0x24e)];
          iVar12 = 0;
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x17c4) = *(int *)((long)chip + 0x17c4) + iVar12;
        }
      }
      if (*(char *)((long)chip + 0x31d) == '\0') {
        *(undefined4 *)((long)chip + 0x17c0) = 0;
        iVar12 = *(int *)((long)chip + 0x29c);
        iVar13 = *(int *)((long)chip + 0x298);
        uVar9 = *(uint *)((long)chip + 0x2b0);
        uVar8 = *(uint *)((long)chip + 0x16fc);
        iVar2 = *(int *)((long)chip + 0x288);
        iVar3 = *(int *)((long)chip + 0x28c);
        *(int *)((long)chip + 0x288) = iVar3;
        **(int **)((long)chip + 0x280) = **(int **)((long)chip + 0x280) + iVar3;
        uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
        *(undefined4 *)((long)chip + 0x28c) = 0;
        if (uVar9 < 0x180) {
          iVar12 = 0;
          iVar13 = iVar3 + iVar2;
          if (*(byte *)((long)chip + 0x278) == 0) {
            iVar13 = iVar12;
          }
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((*(uint *)((long)chip + 0x270) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)chip + 0x278) & 0x1f)) >> 0x10 & 0x3ff) +
                          (uint)*(ushort *)((long)chip + 0x2b6)];
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x28c) = iVar12;
        }
        uVar9 = (*(uint *)((long)chip + 0x308) & *(uint *)((long)chip + 0x16fc)) +
                *(int *)((long)chip + 0x2f4) + *(int *)((long)chip + 0x2f0);
        if (uVar9 < 0x180) {
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((uint)*(ushort *)((long)chip + 0x2ca) + *(int *)((long)chip + 0x17c0) &
                          0x3ff) + (uint)*(ushort *)((long)chip + 0x30e)];
          iVar12 = 0;
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x17c4) = *(int *)((long)chip + 0x17c4) + iVar12;
        }
      }
      if (*(char *)((long)chip + 0x3dd) == '\0') {
        *(undefined4 *)((long)chip + 0x17c0) = 0;
        iVar12 = *(int *)((long)chip + 0x35c);
        iVar13 = *(int *)((long)chip + 0x358);
        uVar9 = *(uint *)((long)chip + 0x370);
        uVar8 = *(uint *)((long)chip + 0x16fc);
        iVar2 = *(int *)((long)chip + 0x348);
        iVar3 = *(int *)((long)chip + 0x34c);
        *(int *)((long)chip + 0x348) = iVar3;
        **(int **)((long)chip + 0x340) = **(int **)((long)chip + 0x340) + iVar3;
        uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
        *(undefined4 *)((long)chip + 0x34c) = 0;
        if (uVar9 < 0x180) {
          iVar12 = 0;
          iVar13 = iVar3 + iVar2;
          if (*(byte *)((long)chip + 0x338) == 0) {
            iVar13 = iVar12;
          }
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((*(uint *)((long)chip + 0x330) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)chip + 0x338) & 0x1f)) >> 0x10 & 0x3ff) +
                          (uint)*(ushort *)((long)chip + 0x376)];
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x34c) = iVar12;
        }
        uVar9 = (*(uint *)((long)chip + 0x3c8) & *(uint *)((long)chip + 0x16fc)) +
                *(int *)((long)chip + 0x3b4) + *(int *)((long)chip + 0x3b0);
        if (uVar9 < 0x180) {
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((uint)*(ushort *)((long)chip + 0x38a) + *(int *)((long)chip + 0x17c0) &
                          0x3ff) + (uint)*(ushort *)((long)chip + 0x3ce)];
          iVar12 = 0;
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x17c4) = *(int *)((long)chip + 0x17c4) + iVar12;
        }
      }
      if (*(char *)((long)chip + 0x49d) == '\0') {
        *(undefined4 *)((long)chip + 0x17c0) = 0;
        iVar12 = *(int *)((long)chip + 0x41c);
        iVar13 = *(int *)((long)chip + 0x418);
        uVar9 = *(uint *)((long)chip + 0x430);
        uVar8 = *(uint *)((long)chip + 0x16fc);
        iVar2 = *(int *)((long)chip + 0x408);
        iVar3 = *(int *)((long)chip + 0x40c);
        *(int *)((long)chip + 0x408) = iVar3;
        **(int **)((long)chip + 0x400) = **(int **)((long)chip + 0x400) + iVar3;
        uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
        *(undefined4 *)((long)chip + 0x40c) = 0;
        if (uVar9 < 0x180) {
          iVar12 = 0;
          iVar13 = iVar3 + iVar2;
          if (*(byte *)((long)chip + 0x3f8) == 0) {
            iVar13 = iVar12;
          }
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((*(uint *)((long)chip + 0x3f0) & 0x3ff0000) +
                           (iVar13 << (*(byte *)((long)chip + 0x3f8) & 0x1f)) >> 0x10 & 0x3ff) +
                          (uint)*(ushort *)((long)chip + 0x436)];
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x40c) = iVar12;
        }
        uVar9 = (*(uint *)((long)chip + 0x488) & *(uint *)((long)chip + 0x16fc)) +
                *(int *)((long)chip + 0x474) + *(int *)((long)chip + 0x470);
        if (uVar9 < 0x180) {
          uVar9 = uVar9 * 0x10 +
                  sin_tab[((uint)*(ushort *)((long)chip + 0x44a) + *(int *)((long)chip + 0x17c0) &
                          0x3ff) + (uint)*(ushort *)((long)chip + 0x48e)];
          iVar12 = 0;
          if (uVar9 < 0x1800) {
            iVar12 = tl_tab[uVar9];
          }
          *(int *)((long)chip + 0x17c4) = *(int *)((long)chip + 0x17c4) + iVar12;
        }
      }
      if ((bVar1 & 0x20) == 0) {
        if (*(char *)((long)chip + 0x55d) == '\0') {
          *(undefined4 *)((long)chip + 0x17c0) = 0;
          iVar12 = *(int *)((long)chip + 0x4dc);
          iVar13 = *(int *)((long)chip + 0x4d8);
          uVar9 = *(uint *)((long)chip + 0x4f0);
          uVar8 = *(uint *)((long)chip + 0x16fc);
          iVar2 = *(int *)((long)chip + 0x4c8);
          iVar3 = *(int *)((long)chip + 0x4cc);
          *(int *)((long)chip + 0x4c8) = iVar3;
          **(int **)((long)chip + 0x4c0) = **(int **)((long)chip + 0x4c0) + iVar3;
          uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
          *(undefined4 *)((long)chip + 0x4cc) = 0;
          if (uVar9 < 0x180) {
            iVar12 = 0;
            iVar13 = iVar3 + iVar2;
            if (*(byte *)((long)chip + 0x4b8) == 0) {
              iVar13 = iVar12;
            }
            uVar9 = uVar9 * 0x10 +
                    sin_tab[((*(uint *)((long)chip + 0x4b0) & 0x3ff0000) +
                             (iVar13 << (*(byte *)((long)chip + 0x4b8) & 0x1f)) >> 0x10 & 0x3ff) +
                            (uint)*(ushort *)((long)chip + 0x4f6)];
            if (uVar9 < 0x1800) {
              iVar12 = tl_tab[uVar9];
            }
            *(int *)((long)chip + 0x4cc) = iVar12;
          }
          uVar9 = (*(uint *)((long)chip + 0x548) & *(uint *)((long)chip + 0x16fc)) +
                  *(int *)((long)chip + 0x534) + *(int *)((long)chip + 0x530);
          if (uVar9 < 0x180) {
            uVar9 = uVar9 * 0x10 +
                    sin_tab[((uint)*(ushort *)((long)chip + 0x50a) + *(int *)((long)chip + 0x17c0) &
                            0x3ff) + (uint)*(ushort *)((long)chip + 0x54e)];
            iVar12 = 0;
            if (uVar9 < 0x1800) {
              iVar12 = tl_tab[uVar9];
            }
            *(int *)((long)chip + 0x17c4) = *(int *)((long)chip + 0x17c4) + iVar12;
          }
        }
        if (*(char *)((long)chip + 0x61d) == '\0') {
          *(undefined4 *)((long)chip + 0x17c0) = 0;
          iVar12 = *(int *)((long)chip + 0x59c);
          iVar13 = *(int *)((long)chip + 0x598);
          uVar9 = *(uint *)((long)chip + 0x5b0);
          uVar8 = *(uint *)((long)chip + 0x16fc);
          iVar2 = *(int *)((long)chip + 0x588);
          iVar3 = *(int *)((long)chip + 0x58c);
          *(int *)((long)chip + 0x588) = iVar3;
          **(int **)((long)chip + 0x580) = **(int **)((long)chip + 0x580) + iVar3;
          uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
          *(undefined4 *)((long)chip + 0x58c) = 0;
          if (uVar9 < 0x180) {
            iVar12 = 0;
            iVar13 = iVar3 + iVar2;
            if (*(byte *)((long)chip + 0x578) == 0) {
              iVar13 = iVar12;
            }
            uVar9 = uVar9 * 0x10 +
                    sin_tab[((*(uint *)((long)chip + 0x570) & 0x3ff0000) +
                             (iVar13 << (*(byte *)((long)chip + 0x578) & 0x1f)) >> 0x10 & 0x3ff) +
                            (uint)*(ushort *)((long)chip + 0x5b6)];
            if (uVar9 < 0x1800) {
              iVar12 = tl_tab[uVar9];
            }
            *(int *)((long)chip + 0x58c) = iVar12;
          }
          uVar9 = (*(uint *)((long)chip + 0x608) & *(uint *)((long)chip + 0x16fc)) +
                  *(int *)((long)chip + 0x5f4) + *(int *)((long)chip + 0x5f0);
          if (uVar9 < 0x180) {
            uVar9 = uVar9 * 0x10 +
                    sin_tab[((uint)*(ushort *)((long)chip + 0x5ca) + *(int *)((long)chip + 0x17c0) &
                            0x3ff) + (uint)*(ushort *)((long)chip + 0x60e)];
            iVar12 = 0;
            if (uVar9 < 0x1800) {
              iVar12 = tl_tab[uVar9];
            }
            *(int *)((long)chip + 0x17c4) = *(int *)((long)chip + 0x17c4) + iVar12;
          }
        }
        if (*(char *)((long)chip + 0x6dd) == '\0') {
          *(undefined4 *)((long)chip + 0x17c0) = 0;
          iVar12 = *(int *)((long)chip + 0x65c);
          iVar13 = *(int *)((long)chip + 0x658);
          uVar9 = *(uint *)((long)chip + 0x670);
          uVar8 = *(uint *)((long)chip + 0x16fc);
          iVar2 = *(int *)((long)chip + 0x648);
          iVar3 = *(int *)((long)chip + 0x64c);
          *(int *)((long)chip + 0x648) = iVar3;
          **(int **)((long)chip + 0x640) = **(int **)((long)chip + 0x640) + iVar3;
          uVar9 = (uVar9 & uVar8) + iVar12 + iVar13;
          *(undefined4 *)((long)chip + 0x64c) = 0;
          if (uVar9 < 0x180) {
            iVar12 = 0;
            iVar13 = iVar3 + iVar2;
            if (*(byte *)((long)chip + 0x638) == 0) {
              iVar13 = iVar12;
            }
            uVar9 = uVar9 * 0x10 +
                    sin_tab[((*(uint *)((long)chip + 0x630) & 0x3ff0000) +
                             (iVar13 << (*(byte *)((long)chip + 0x638) & 0x1f)) >> 0x10 & 0x3ff) +
                            (uint)*(ushort *)((long)chip + 0x676)];
            if (uVar9 < 0x1800) {
              iVar12 = tl_tab[uVar9];
            }
            *(int *)((long)chip + 0x64c) = iVar12;
          }
          uVar9 = (*(uint *)((long)chip + 0x6c8) & *(uint *)((long)chip + 0x16fc)) +
                  *(int *)((long)chip + 0x6b4) + *(int *)((long)chip + 0x6b0);
          if (uVar9 < 0x180) {
            uVar9 = uVar9 * 0x10 +
                    sin_tab[((uint)*(ushort *)((long)chip + 0x68a) + *(int *)((long)chip + 0x17c0) &
                            0x3ff) + (uint)*(ushort *)((long)chip + 0x6ce)];
            iVar12 = 0;
            if (uVar9 < 0x1800) {
              iVar12 = tl_tab[uVar9];
            }
            *(int *)((long)chip + 0x17c4) = *(int *)((long)chip + 0x17c4) + iVar12;
          }
        }
      }
      else {
        OPL_CALC_RH((FM_OPL *)chip,(OPL_CH *)((long)chip + 0x20),*(uint *)((long)chip + 0x1718) & 1)
        ;
      }
      DVar4 = *(DEV_SMPL *)((long)chip + 0x17c4);
      pDVar5[uVar14] = DVar4;
      pDVar6[uVar14] = DVar4;
      advance((FM_OPL *)chip);
      uVar14 = uVar14 + 1;
    } while (length != uVar14);
  }
  return;
}

Assistant:

void ym3526_update_one(void *chip, UINT32 length, DEV_SMPL **buffer)
{
	FM_OPL      *OPL = (FM_OPL *)chip;
	UINT8       rhythm = OPL->rhythm&0x20;
	DEV_SMPL    *bufL;
	DEV_SMPL    *bufR;
	UINT32 i;

	if (! length)
	{
		refresh_eg(OPL);
		return;
	}
	
	bufL = buffer[0];
	bufR = buffer[1];
	for( i=0; i < length ; i++ )
	{
		int lt;

		OPL->output[0] = 0;

		advance_lfo(OPL);

		/* FM part */
		OPL_CALC_CH(OPL, &OPL->P_CH[0]);
		OPL_CALC_CH(OPL, &OPL->P_CH[1]);
		OPL_CALC_CH(OPL, &OPL->P_CH[2]);
		OPL_CALC_CH(OPL, &OPL->P_CH[3]);
		OPL_CALC_CH(OPL, &OPL->P_CH[4]);
		OPL_CALC_CH(OPL, &OPL->P_CH[5]);

		if(!rhythm)
		{
			OPL_CALC_CH(OPL, &OPL->P_CH[6]);
			OPL_CALC_CH(OPL, &OPL->P_CH[7]);
			OPL_CALC_CH(OPL, &OPL->P_CH[8]);
		}
		else        /* Rhythm part */
		{
			OPL_CALC_RH(OPL, &OPL->P_CH[0], (OPL->noise_rng>>0)&1 );
		}

		lt = OPL->output[0];

		/* store to sound buffer */
		bufL[i] = lt;
		bufR[i] = lt;

		advance(OPL);
	}

}